

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleClock.hpp
# Opt level: O3

uint16_t __thiscall Apple::Clock::ClockStorage::perform(ClockStorage *this,uint8_t command)

{
  Phase PVar1;
  uint uVar2;
  uchar *puVar3;
  
  PVar1 = this->phase_;
  if (PVar1 - SecondAddressByteRead < 2) {
    if ((command & 0x83) != 0) {
      return 0x101;
    }
    uVar2 = (uint)(command >> 2) | this->address_;
    this->address_ = uVar2;
    if (PVar1 == SecondAddressByteRead) {
      this->phase_ = Command;
      return (uint16_t)(this->data_)._M_elems[uVar2];
    }
  }
  else {
    if (PVar1 == WriteData) {
      uVar2 = this->address_;
      if ((ulong)uVar2 == 0x200) {
        return 0x101;
      }
      if (uVar2 != 0x201) {
        if (-1 < (char)this->write_protect_) {
          puVar3 = (this->seconds_)._M_elems + (byte)uVar2;
          if (uVar2 < 0x100) {
            puVar3 = (this->data_)._M_elems + uVar2;
          }
          *puVar3 = command;
        }
        this->phase_ = Command;
        return 0x101;
      }
      this->write_protect_ = command;
      return 0x101;
    }
    if (PVar1 != Command) {
      return 0x100;
    }
    uVar2 = command & 0x70;
    if ((command & 0x70) == 0) {
      uVar2 = command >> 2 & 3 | 0x100;
    }
    else if (uVar2 == 0x20) {
      uVar2 = command >> 2 & 3 | 0x10;
    }
    else if (uVar2 == 0x30) {
      if ((command & 8) != 0) {
        this->address_ = (command & 7) << 5;
        this->phase_ = (-1 < (char)command) + SecondAddressByteRead;
        return 0x100;
      }
      uVar2 = 0x201 - ((command & 4) == 0);
    }
    else {
      if ((command & 0x40) == 0) {
        return 0x101;
      }
      uVar2 = command >> 2 & 0xf;
    }
    this->address_ = uVar2;
    if ((char)command < '\0') {
      if ((uVar2 & 0xfffffffe) == 0x200) {
        return 0x101;
      }
      puVar3 = (this->seconds_)._M_elems + (uVar2 & 0xff);
      if (uVar2 < 0x100) {
        puVar3 = (this->data_)._M_elems + uVar2;
      }
      return (uint16_t)*puVar3;
    }
  }
  this->phase_ = WriteData;
  return 0x100;
}

Assistant:

uint16_t perform(uint8_t command) {
			/*
				Documented commands:

					z0000001		Seconds register 0 (lowest order byte)
					z0000101		Seconds register 1
					z0001001		Seconds register 2
					z0001101		Seconds register 3
					00110001		Test register (write only)
					00110101		Write-protect register (write only)
					z010aa01		RAM addresses 0x10 - 0x13
					z1aaaa01		RAM addresses 0x00 – 0x0f

					z0111abc, followed by 0defgh00
									RAM address abcdefgh

					z = 1 => a read; z = 0 => a write.

				The top bit of the write-protect register enables (0) or disables (1)
				writes to other locations.

				All the documentation says about the test register is to set the top
				two bits to 0 for normal operation. Abnormal operation is undefined.
			*/
			switch(phase_) {
				case Phase::Command:
					// Decode an address.
					switch(command & 0x70) {
						default:
							if(command & 0x40) {
								// RAM addresses 0x00 – 0x0f.
								address_ = (command >> 2) & 0xf;
							} else return DidComplete;	// Unrecognised.
						break;

						case 0x00:
							// A time access.
							address_ = SecondsBuffer + ((command >> 2)&3);
						break;
						case 0x30:
							// Either a register access or an extended instruction.
							if(command & 0x08) {
								address_ = unsigned((command & 0x7) << 5);
								phase_ = (command & 0x80) ? Phase::SecondAddressByteRead : Phase::SecondAddressByteWrite;
								return NoResult;
							} else {
								address_ = (command & 4) ? RegisterWriteProtect : RegisterTest;
							}
						break;
						case 0x20:
							// RAM addresses 0x10 – 0x13.
							address_ = 0x10 + ((command >> 2) & 0x3);
						break;
					}

					// If this is a read, return a result; otherwise prepare to write.
					if(command & 0x80) {
						// The two registers are write-only.
						if(address_ == RegisterTest || address_ == RegisterWriteProtect) {
							return DidComplete;
						}
						return (address_ >= SecondsBuffer) ? seconds_[address_ & 0xff] : data_[address_];
					}
					phase_ = Phase::WriteData;
				return NoResult;

				case Phase::SecondAddressByteRead:
				case Phase::SecondAddressByteWrite:
					if(command & 0x83) {
						return DidComplete;
					}
					address_ |= command >> 2;

					if(phase_ == Phase::SecondAddressByteRead) {
						phase_ = Phase::Command;
						return data_[address_];	// Only RAM accesses can get this far.
					} else {
						phase_ = Phase::WriteData;
					}
				return NoResult;

				case Phase::WriteData:
					// First test: is this to the write-protect register?
					if(address_ == RegisterWriteProtect) {
						write_protect_ = command;
						return DidComplete;
					}

					if(address_ == RegisterTest) {
						// No documentation here.
						return DidComplete;
					}

					// No other writing is permitted if the write protect
					// register won't allow it.
					if(!(write_protect_ & 0x80)) {
						if(address_ >= SecondsBuffer) {
							seconds_[address_ & 0xff] = command;
						} else {
							data_[address_] = command;
						}
					}

					phase_ = Phase::Command;
				return DidComplete;
			}

			return NoResult;
		}